

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::VertexAttribBindingBase::CheckProgram
          (VertexAttribBindingBase *this,GLuint program)

{
  GLuint GVar1;
  undefined4 uVar2;
  GLsizei maxCount;
  GLint GVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  allocator_type local_b1;
  undefined1 local_b0 [8];
  vector<char,_std::allocator<char>_> log_1;
  GLint length;
  vector<char,_std::allocator<char>_> log;
  undefined1 local_70 [8];
  vector<char,_std::allocator<char>_> source;
  GLint length_1;
  GLenum type;
  GLint i;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  int local_18;
  GLint attached_shaders;
  GLint status;
  GLuint program_local;
  VertexAttribBindingBase *this_local;
  
  attached_shaders = program;
  _status = this;
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,0x8b82,
             &local_18);
  if (local_18 == 0) {
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,attached_shaders,
               0x8b85,(GLint *)((long)&shaders.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (0 < shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_) {
      sVar4 = (size_type)
              shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<unsigned_int>::allocator(&local_39);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,sVar4,&local_39);
      std::allocator<unsigned_int>::~allocator(&local_39);
      GVar3 = attached_shaders;
      maxCount = shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
      glu::CallLogWrapper::glGetAttachedShaders
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar3,maxCount,
                 (GLsizei *)0x0,pvVar5);
      for (length_1 = 0;
          length_1 <
          shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; length_1 = length_1 + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                            (long)length_1);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b4f,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x14);
        if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8b30) {
          anon_unknown_0::Output("*** Fragment Shader ***\n");
        }
        else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8b31) {
          anon_unknown_0::Output("*** Vertex Shader ***\n");
        }
        else {
          anon_unknown_0::Output("*** Unknown Shader ***\n");
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                            (long)length_1);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b88,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
          sVar4 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_70,sVar4,
                     (allocator_type *)
                     &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              (long)length_1);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
          GVar1 = *pvVar5;
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_70,0);
          glu::CallLogWrapper::glGetShaderSource
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                     (GLsizei *)0x0,pvVar6);
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_70,0);
          anon_unknown_0::Output("%s\n",pvVar6);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_70);
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                            (long)length_1);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b84,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
          sVar4 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&length,sVar4,
                     (allocator_type *)
                     &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              (long)length_1);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
          GVar1 = *pvVar5;
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&length,0);
          glu::CallLogWrapper::glGetShaderInfoLog
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                     (GLsizei *)0x0,pvVar6);
          pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&length,0);
          anon_unknown_0::Output("%s\n",pvVar6);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)&length);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    }
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,attached_shaders,
               0x8b84,(GLint *)&log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10);
    if (0 < (int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
      sVar4 = (size_type)(int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_b0,sVar4,&local_b1);
      std::allocator<char>::~allocator(&local_b1);
      GVar3 = attached_shaders;
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_b0,0);
      glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar3,
                 log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,(GLsizei *)0x0
                 ,pvVar6);
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_b0,0);
      anon_unknown_0::Output("%s\n",pvVar6);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_b0);
    }
  }
  return (bool)(-(local_18 == 1) & 1);
}

Assistant:

bool CheckProgram(GLuint program)
	{
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}
		return status == GL_TRUE ? true : false;
	}